

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O1

int read_dns_header(dns_header *header,char *src)

{
  header->id = *(ushort *)src << 8 | *(ushort *)src >> 8;
  header->field_1 = *(anon_union_2_2_657f633e_for_dns_header_1 *)(src + 2);
  header->qdcount = *(ushort *)(src + 4) << 8 | *(ushort *)(src + 4) >> 8;
  header->ancount = *(ushort *)(src + 6) << 8 | *(ushort *)(src + 6) >> 8;
  header->nscount = *(ushort *)(src + 8) << 8 | *(ushort *)(src + 8) >> 8;
  header->adcount = *(ushort *)(src + 10) << 8 | *(ushort *)(src + 10) >> 8;
  return 0xc;
}

Assistant:

int read_dns_header(struct dns_header *header, char *src) {
  struct dns_header *header_ = (struct dns_header *)src;
  header->id = ntohs(header_->id);
  header->flags = header_->flags;
  header->qdcount = ntohs(header_->qdcount);
  header->ancount = ntohs(header_->ancount);
  header->nscount = ntohs(header_->nscount);
  header->adcount = ntohs(header_->adcount);
  return sizeof(struct dns_header);
}